

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to1_int8.h
# Opt level: O2

void ncnn::im2col_sgemm_pack8to1_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  int *piVar13;
  byte bVar14;
  undefined1 (*pauVar15) [16];
  undefined8 *puVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  char *kptr0;
  undefined1 (*pauVar23) [32];
  undefined1 (*pauVar24) [16];
  undefined8 *puVar25;
  int iVar26;
  void *pvVar27;
  ulong uVar28;
  undefined1 (*pauVar29) [32];
  long lVar30;
  undefined4 *puVar31;
  ulong uVar32;
  undefined4 *puVar33;
  undefined4 *puVar34;
  int q;
  ulong uVar35;
  undefined4 *puVar36;
  ulong uVar37;
  int iVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 local_a8 [64];
  size_t local_68;
  ulong local_58;
  ulong local_50;
  Mat *local_48;
  void *local_40;
  long local_38;
  
  uVar2 = bottom_im2col->w;
  uVar37 = (ulong)(int)uVar2;
  iVar38 = bottom_im2col->h;
  uVar20 = bottom_im2col->c;
  local_50 = (ulong)top_blob->c;
  local_68 = 0;
  local_a8._0_8_ = (void *)0x0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_8_ = 0;
  local_a8._24_4_ = 0;
  local_a8._32_8_ = (Allocator *)0x0;
  local_a8._40_4_ = 0;
  local_a8._44_4_ = 0;
  local_a8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  if ((long)uVar37 < 4) {
    uVar18 = uVar2;
    iVar19 = iVar38;
    if (1 < (int)uVar2) {
      iVar19 = iVar38 * 2;
      uVar18 = (uVar2 & 1) + 1;
    }
  }
  else {
    uVar18 = (uVar2 & 1) + (uVar2 >> 2) + (uint)((uVar2 >> 1 & 1) != 0);
    iVar19 = iVar38 * 4;
  }
  local_48 = top_blob;
  Mat::create((Mat *)local_a8,iVar19,uVar20,uVar18,8,8,opt->workspace_allocator);
  uVar21 = 0;
  iVar19 = 0;
  if (0 < iVar38) {
    iVar19 = iVar38;
  }
  uVar32 = 0;
  if (0 < (int)uVar20) {
    uVar32 = (ulong)uVar20;
  }
  uVar22 = (ulong)(uint)((int)uVar2 >> 2);
  if ((int)uVar2 >> 2 < 1) {
    uVar22 = uVar21;
  }
  for (uVar28 = 0; uVar28 != uVar22; uVar28 = uVar28 + 1) {
    pauVar29 = (undefined1 (*) [32])(local_68 * uVar28 * local_a8._16_8_ + local_a8._0_8_);
    for (uVar35 = 0; uVar35 != uVar32; uVar35 = uVar35 + 1) {
      pauVar23 = (undefined1 (*) [32])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar35 + uVar21);
      iVar26 = iVar19;
      while (bVar39 = iVar26 != 0, iVar26 = iVar26 + -1, bVar39) {
        *pauVar29 = *pauVar23;
        pauVar29 = pauVar29 + 1;
        pauVar23 = (undefined1 (*) [32])(*pauVar23 + uVar37 * 8);
      }
    }
    uVar21 = uVar21 + 0x20;
  }
  uVar18 = uVar2 >> 1 & 1;
  lVar30 = (uVar37 & 0xfffffffffffffffc) << 3;
  for (uVar21 = 0; iVar26 = (int)(uVar37 & 0xfffffffffffffffc), uVar21 != uVar18;
      uVar21 = uVar21 + 1) {
    iVar26 = iVar26 + (int)uVar21 * 2;
    pauVar15 = (undefined1 (*) [16])
               ((long)((iVar26 % 4 >> 1) + iVar26 / 4) * local_68 * local_a8._16_8_ + local_a8._0_8_
               );
    for (uVar22 = 0; uVar22 != uVar32; uVar22 = uVar22 + 1) {
      pauVar24 = (undefined1 (*) [16])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar22 + lVar30);
      iVar26 = iVar19;
      while (bVar39 = iVar26 != 0, iVar26 = iVar26 + -1, bVar39) {
        *pauVar15 = *pauVar24;
        pauVar15 = pauVar15 + 1;
        pauVar24 = (undefined1 (*) [16])(*pauVar24 + uVar37 * 8);
      }
    }
    lVar30 = lVar30 + 0x10;
  }
  uVar21 = (ulong)(int)(iVar26 + uVar18 * 2);
  lVar30 = uVar21 * 8;
  for (; (long)uVar21 < (long)uVar37; uVar21 = uVar21 + 1) {
    uVar18 = (int)uVar21 >> 0x1f;
    uVar22 = (ulong)uVar18 << 0x20 | uVar21 & 0xffffffff;
    puVar16 = (undefined8 *)
              ((long)((int)((long)((ulong)uVar18 << 0x20 | uVar21 & 0xffffffff) % 2) +
                      (int)((long)uVar22 / 4) + (int)(char)((char)((long)uVar22 % 4) / '\x02')) *
               local_68 * local_a8._16_8_ + local_a8._0_8_);
    pvVar3 = bottom_im2col->data;
    for (uVar22 = 0; uVar22 != uVar32; uVar22 = uVar22 + 1) {
      puVar25 = (undefined8 *)
                ((long)pvVar3 + bottom_im2col->cstep * bottom_im2col->elemsize * uVar22 + lVar30);
      iVar26 = iVar19;
      while (bVar39 = iVar26 != 0, iVar26 = iVar26 + -1, bVar39) {
        *puVar16 = *puVar25;
        puVar16 = puVar16 + 1;
        puVar25 = puVar25 + uVar37;
      }
    }
    lVar30 = lVar30 + 8;
  }
  uVar18 = (int)local_50 >> 2;
  local_38 = local_48->cstep * local_48->elemsize;
  uVar32 = 0;
  uVar21 = (ulong)(uVar20 * iVar38);
  if ((int)(uVar20 * iVar38) < 1) {
    uVar21 = uVar32;
  }
  local_40 = local_48->data;
  local_58 = (ulong)uVar18;
  if ((int)uVar18 < 1) {
    local_58 = uVar32;
  }
  for (; iVar38 = (int)uVar21, uVar32 != local_58; uVar32 = uVar32 + 1) {
    puVar31 = (undefined4 *)(uVar32 * 4 * local_38 + (long)local_40);
    puVar33 = (undefined4 *)((uVar32 * 4 + 1) * local_38 + (long)local_40);
    puVar34 = (undefined4 *)((uVar32 * 4 + 2) * local_38 + (long)local_40);
    puVar36 = (undefined4 *)((uVar32 * 4 + 3) * local_38 + (long)local_40);
    lVar30 = kernel->cstep * kernel->elemsize * uVar32;
    pvVar3 = kernel->data;
    pvVar27 = (void *)local_a8._0_8_;
    for (uVar22 = 0; (long)(uVar22 | 3) < (long)uVar37; uVar22 = uVar22 + 4) {
      auVar43 = ZEXT1664((undefined1  [16])0x0);
      lVar17 = 0;
      auVar45 = ZEXT1664((undefined1  [16])0x0);
      auVar48 = ZEXT1664((undefined1  [16])0x0);
      auVar50 = ZEXT1664((undefined1  [16])0x0);
      auVar53 = ZEXT1664((undefined1  [16])0x0);
      auVar55 = ZEXT1664((undefined1  [16])0x0);
      auVar57 = ZEXT1664((undefined1  [16])0x0);
      auVar59 = ZEXT1664((undefined1  [16])0x0);
      uVar28 = uVar21;
      while( true ) {
        iVar19 = (int)uVar28;
        uVar28 = (ulong)(iVar19 - 1);
        auVar56 = auVar57._0_32_;
        auVar58 = auVar59._0_32_;
        auVar52 = auVar53._0_32_;
        auVar54 = auVar55._0_32_;
        auVar47 = auVar48._0_32_;
        auVar49 = auVar50._0_32_;
        auVar42 = auVar43._0_32_;
        auVar44 = auVar45._0_32_;
        if (iVar19 == 0) break;
        auVar10 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar27 + lVar17));
        auVar11 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar3 + lVar17 + lVar30));
        auVar12 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar3 + lVar17 + lVar30 + 0x10));
        auVar9 = vpmaddwd_avx2(auVar10,auVar11);
        auVar58 = vpaddd_avx2(auVar9,auVar58);
        auVar59 = ZEXT3264(auVar58);
        auVar9 = vpermq_avx2(auVar10,0x4e);
        auVar58 = vpmaddwd_avx2(auVar9,auVar11);
        auVar56 = vpaddd_avx2(auVar58,auVar56);
        auVar57 = ZEXT3264(auVar56);
        auVar56 = vpmaddwd_avx2(auVar10,auVar12);
        auVar54 = vpaddd_avx2(auVar56,auVar54);
        auVar55 = ZEXT3264(auVar54);
        auVar54 = vpmaddwd_avx2(auVar9,auVar12);
        auVar52 = vpaddd_avx2(auVar54,auVar52);
        auVar53 = ZEXT3264(auVar52);
        auVar54 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar27 + lVar17 + 0x10));
        auVar52 = vpmaddwd_avx2(auVar54,auVar11);
        auVar49 = vpaddd_avx2(auVar52,auVar49);
        auVar50 = ZEXT3264(auVar49);
        auVar52 = vpermq_avx2(auVar54,0x4e);
        auVar49 = vpmaddwd_avx2(auVar52,auVar11);
        auVar47 = vpaddd_avx2(auVar49,auVar47);
        auVar48 = ZEXT3264(auVar47);
        auVar47 = vpmaddwd_avx2(auVar54,auVar12);
        auVar44 = vpaddd_avx2(auVar47,auVar44);
        auVar45 = ZEXT3264(auVar44);
        auVar44 = vpmaddwd_avx2(auVar52,auVar12);
        auVar42 = vpaddd_avx2(auVar44,auVar42);
        auVar43 = ZEXT3264(auVar42);
        lVar17 = lVar17 + 0x20;
      }
      auVar9 = vpunpckldq_avx2(auVar58,auVar56);
      auVar10 = vpunpckldq_avx2(auVar54,auVar52);
      auVar56 = vpunpckhdq_avx2(auVar58,auVar56);
      auVar54 = vpunpckhdq_avx2(auVar54,auVar52);
      auVar58 = vpunpcklqdq_avx2(auVar9,auVar10);
      auVar52 = vpunpckhqdq_avx2(auVar9,auVar10);
      auVar52 = vpaddd_avx2(auVar58,auVar52);
      auVar58 = vpunpcklqdq_avx2(auVar56,auVar54);
      auVar54 = vpunpckhqdq_avx2(auVar56,auVar54);
      auVar54 = vpaddd_avx2(auVar54,auVar58);
      auVar52 = vpaddd_avx2(auVar52,auVar54);
      auVar54 = vpunpckldq_avx2(auVar49,auVar47);
      auVar56 = vpunpckldq_avx2(auVar44,auVar42);
      auVar47 = vpunpckhdq_avx2(auVar49,auVar47);
      auVar44 = vpunpckhdq_avx2(auVar44,auVar42);
      auVar49 = vpunpcklqdq_avx2(auVar54,auVar56);
      auVar42 = vpunpckhqdq_avx2(auVar54,auVar56);
      auVar42 = vpaddd_avx2(auVar49,auVar42);
      auVar49 = vpunpcklqdq_avx2(auVar47,auVar44);
      *puVar31 = auVar52._0_4_;
      *puVar33 = auVar52._20_4_;
      auVar44 = vpunpckhqdq_avx2(auVar47,auVar44);
      *puVar34 = auVar52._8_4_;
      auVar44 = vpaddd_avx2(auVar44,auVar49);
      *puVar36 = auVar52._28_4_;
      auVar42 = vpaddd_avx2(auVar42,auVar44);
      puVar31[1] = auVar52._4_4_;
      puVar33[1] = auVar52._16_4_;
      puVar34[1] = auVar52._12_4_;
      puVar36[1] = auVar52._24_4_;
      puVar31[2] = auVar42._0_4_;
      puVar33[2] = auVar42._20_4_;
      puVar34[2] = auVar42._8_4_;
      puVar36[2] = auVar42._28_4_;
      puVar31[3] = auVar42._4_4_;
      puVar33[3] = auVar42._16_4_;
      puVar34[3] = auVar42._12_4_;
      puVar36[3] = auVar42._24_4_;
      puVar31 = puVar31 + 4;
      puVar33 = puVar33 + 4;
      puVar34 = puVar34 + 4;
      puVar36 = puVar36 + 4;
      pvVar27 = (void *)((long)pvVar27 + local_68 * local_a8._16_8_);
    }
    lVar30 = kernel->cstep * kernel->elemsize * uVar32;
    pvVar3 = kernel->data;
    bVar14 = 0;
    for (; (int)((uint)uVar22 | 1) < (int)uVar2; uVar22 = (ulong)((uint)uVar22 + 2)) {
      auVar43 = ZEXT1664((undefined1  [16])0x0);
      lVar17 = 0;
      auVar45 = ZEXT1664((undefined1  [16])0x0);
      auVar48 = ZEXT1664((undefined1  [16])0x0);
      auVar50 = ZEXT1664((undefined1  [16])0x0);
      uVar28 = uVar21;
      while( true ) {
        iVar19 = (int)uVar28;
        uVar28 = (ulong)(iVar19 - 1);
        auVar47 = auVar48._0_32_;
        auVar49 = auVar50._0_32_;
        auVar42 = auVar43._0_32_;
        auVar44 = auVar45._0_32_;
        if (iVar19 == 0) break;
        auVar54 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                  (local_a8._0_8_ +
                                  lVar17 + (ulong)((bVar14 & 1) + ((uint)(uVar22 >> 2) & 0x3fffffff)
                                                  ) * local_68 * local_a8._16_8_));
        auVar56 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar3 + lVar17 * 2 + lVar30));
        auVar58 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar3 + lVar17 * 2 + lVar30 + 0x10));
        auVar52 = vpmaddwd_avx2(auVar54,auVar56);
        auVar49 = vpaddd_avx2(auVar52,auVar49);
        auVar50 = ZEXT3264(auVar49);
        auVar52 = vpermq_avx2(auVar54,0x4e);
        auVar49 = vpmaddwd_avx2(auVar52,auVar56);
        auVar47 = vpaddd_avx2(auVar49,auVar47);
        auVar48 = ZEXT3264(auVar47);
        auVar47 = vpmaddwd_avx2(auVar54,auVar58);
        auVar44 = vpaddd_avx2(auVar47,auVar44);
        auVar45 = ZEXT3264(auVar44);
        auVar44 = vpmaddwd_avx2(auVar52,auVar58);
        auVar42 = vpaddd_avx2(auVar44,auVar42);
        auVar43 = ZEXT3264(auVar42);
        lVar17 = lVar17 + 0x10;
      }
      auVar52 = vpunpckldq_avx2(auVar49,auVar47);
      auVar54 = vpunpckldq_avx2(auVar44,auVar42);
      auVar47 = vpunpckhdq_avx2(auVar49,auVar47);
      auVar44 = vpunpckhdq_avx2(auVar44,auVar42);
      auVar49 = vpunpcklqdq_avx2(auVar52,auVar54);
      auVar42 = vpunpckhqdq_avx2(auVar52,auVar54);
      auVar42 = vpaddd_avx2(auVar49,auVar42);
      auVar49 = vpunpcklqdq_avx2(auVar47,auVar44);
      auVar44 = vpunpckhqdq_avx2(auVar47,auVar44);
      auVar44 = vpaddd_avx2(auVar44,auVar49);
      auVar42 = vpaddd_avx2(auVar42,auVar44);
      *puVar31 = auVar42._0_4_;
      *puVar33 = auVar42._20_4_;
      *puVar34 = auVar42._8_4_;
      *puVar36 = auVar42._28_4_;
      puVar31[1] = auVar42._4_4_;
      puVar33[1] = auVar42._16_4_;
      puVar34[1] = auVar42._12_4_;
      puVar36[1] = auVar42._24_4_;
      puVar31 = puVar31 + 2;
      puVar33 = puVar33 + 2;
      puVar34 = puVar34 + 2;
      puVar36 = puVar36 + 2;
      bVar14 = bVar14 + 1;
    }
    sVar4 = kernel->cstep;
    sVar5 = kernel->elemsize;
    pvVar3 = kernel->data;
    while( true ) {
      uVar20 = (uint)uVar22;
      if ((int)uVar2 <= (int)uVar20) break;
      auVar43 = ZEXT1664((undefined1  [16])0x0);
      auVar45 = ZEXT1664((undefined1  [16])0x0);
      pauVar15 = (undefined1 (*) [16])(sVar4 * uVar32 * sVar5 + (long)pvVar3);
      for (lVar30 = 0; iVar38 != (int)lVar30; lVar30 = lVar30 + 1) {
        auVar41._8_8_ = 0;
        auVar41._0_8_ =
             *(ulong *)(local_a8._0_8_ +
                       lVar30 * 8 +
                       (ulong)((uVar20 & 1) + ((uint)(uVar22 >> 2) & 0x3fffffff) +
                              (uint)((uVar20 >> 1 & 1) != 0)) * local_68 * local_a8._16_8_);
        auVar41 = vpmovsxbw_avx(auVar41);
        auVar42 = vpmovsxbw_avx2(*pauVar15);
        auVar44 = vpmovsxbw_avx2(pauVar15[1]);
        auVar47._0_16_ = ZEXT116(0) * auVar41 + ZEXT116(1) * auVar41;
        auVar47._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar41;
        auVar42 = vpmaddwd_avx2(auVar47,auVar42);
        auVar42 = vpaddd_avx2(auVar42,auVar43._0_32_);
        auVar43 = ZEXT3264(auVar42);
        auVar42 = vpmaddwd_avx2(auVar47,auVar44);
        auVar42 = vpaddd_avx2(auVar42,auVar45._0_32_);
        auVar45 = ZEXT3264(auVar42);
        pauVar15 = pauVar15 + 2;
      }
      auVar41 = vpunpckldq_avx(auVar43._0_16_,auVar43._16_16_);
      auVar46 = vpunpckldq_avx(auVar45._0_16_,auVar45._16_16_);
      auVar51 = vpunpckhdq_avx(auVar43._0_16_,auVar43._16_16_);
      auVar40 = vpunpckhdq_avx(auVar45._0_16_,auVar45._16_16_);
      auVar8 = vpunpcklqdq_avx(auVar41,auVar46);
      auVar41 = vpunpckhqdq_avx(auVar41,auVar46);
      auVar41 = vpaddd_avx(auVar8,auVar41);
      auVar46 = vpunpcklqdq_avx(auVar51,auVar40);
      auVar51 = vpunpckhqdq_avx(auVar51,auVar40);
      auVar51 = vpaddd_avx(auVar51,auVar46);
      auVar41 = vpaddd_avx(auVar41,auVar51);
      *puVar31 = auVar41._0_4_;
      *puVar33 = auVar41._4_4_;
      *puVar34 = auVar41._8_4_;
      *puVar36 = auVar41._12_4_;
      puVar31 = puVar31 + 1;
      puVar33 = puVar33 + 1;
      puVar34 = puVar34 + 1;
      puVar36 = puVar36 + 1;
      uVar22 = (ulong)(uVar20 + 1);
    }
  }
  pvVar3 = local_48->data;
  sVar4 = local_48->cstep;
  sVar5 = local_48->elemsize;
  for (uVar21 = local_50 & 0xfffffffffffffffc; (long)uVar21 < (long)local_50; uVar21 = uVar21 + 1) {
    uVar32 = (ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 | uVar21 & 0xffffffff;
    lVar30 = (long)((int)((long)uVar32 % 4) + (int)((long)uVar32 / 4));
    sVar6 = kernel->cstep;
    sVar7 = kernel->elemsize;
    pauVar15 = (undefined1 (*) [16])(sVar4 * sVar5 * uVar21 + (long)pvVar3);
    pvVar27 = kernel->data;
    for (uVar32 = 0; (long)(uVar32 | 3) < (long)uVar37; uVar32 = uVar32 + 4) {
      pauVar24 = (undefined1 (*) [16])((uVar32 >> 2) * local_68 * local_a8._16_8_ + local_a8._0_8_);
      auVar45 = ZEXT1664((undefined1  [16])0x0);
      auVar43 = ZEXT1664((undefined1  [16])0x0);
      for (lVar17 = 0; iVar38 != (int)lVar17; lVar17 = lVar17 + 1) {
        auVar42 = vpmovsxbw_avx2(*pauVar24);
        auVar44 = vpmovsxbw_avx2(pauVar24[1]);
        auVar51._8_8_ = 0;
        auVar51._0_8_ = *(ulong *)((long)pvVar27 + lVar17 * 8 + sVar6 * lVar30 * sVar7);
        auVar47 = vpmovsxbw_avx2(auVar51);
        auVar47 = vpermq_avx2(auVar47,0x44);
        auVar42 = vpmaddwd_avx2(auVar42,auVar47);
        auVar42 = vpaddd_avx2(auVar42,auVar45._0_32_);
        auVar45 = ZEXT3264(auVar42);
        auVar42 = vpmaddwd_avx2(auVar44,auVar47);
        auVar42 = vpaddd_avx2(auVar42,auVar43._0_32_);
        auVar43 = ZEXT3264(auVar42);
        pauVar24 = pauVar24 + 2;
      }
      auVar41 = vpshufd_avx(auVar45._0_16_,0xee);
      auVar41 = vpaddd_avx(auVar41,auVar45._0_16_);
      auVar51 = vpshufd_avx(auVar45._16_16_,0xee);
      auVar51 = vpaddd_avx(auVar51,auVar45._16_16_);
      auVar51 = vphaddd_avx(auVar41,auVar51);
      auVar41 = vpshufd_avx(auVar43._0_16_,0xee);
      auVar41 = vpaddd_avx(auVar41,auVar43._0_16_);
      auVar40 = vphaddd_avx(auVar41,auVar41);
      auVar41 = vpshufd_avx(auVar43._16_16_,0xee);
      auVar41 = vpaddd_avx(auVar41,auVar43._16_16_);
      auVar41 = vphaddd_avx(auVar41,auVar41);
      auVar51 = vpshufd_avx(auVar51,0xe8);
      auVar51 = vpunpcklqdq_avx(auVar51,auVar40);
      auVar40._0_4_ = auVar41._0_4_;
      auVar40._4_4_ = auVar40._0_4_;
      auVar40._8_4_ = auVar40._0_4_;
      auVar40._12_4_ = auVar40._0_4_;
      auVar41 = vpblendd_avx2(auVar51,auVar40,8);
      *pauVar15 = auVar41;
      pauVar15 = pauVar15 + 1;
    }
    sVar6 = kernel->cstep;
    sVar7 = kernel->elemsize;
    pvVar27 = kernel->data;
    while (uVar20 = (uint)uVar32, (int)(uVar20 | 1) < (int)uVar2) {
      pauVar24 = (undefined1 (*) [16])
                 ((ulong)(((uint)(uVar32 >> 2) & 0x3fffffff) + (uint)((uVar20 >> 1 & 1) != 0)) *
                  local_68 * local_a8._16_8_ + local_a8._0_8_);
      auVar43 = ZEXT1664((undefined1  [16])0x0);
      for (lVar17 = 0; iVar38 != (int)lVar17; lVar17 = lVar17 + 1) {
        auVar42 = vpmovsxbw_avx2(*pauVar24);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *(ulong *)((long)pvVar27 + lVar17 * 8 + sVar6 * lVar30 * sVar7);
        auVar44 = vpmovsxbw_avx2(auVar46);
        auVar44 = vpermq_avx2(auVar44,0x44);
        auVar42 = vpmaddwd_avx2(auVar42,auVar44);
        auVar42 = vpaddd_avx2(auVar42,auVar43._0_32_);
        auVar43 = ZEXT3264(auVar42);
        pauVar24 = pauVar24 + 1;
      }
      auVar41 = vpshufd_avx(auVar43._0_16_,0xee);
      auVar41 = vpaddd_avx(auVar41,auVar43._0_16_);
      auVar51 = vpshufd_avx(auVar43._16_16_,0xee);
      auVar51 = vpaddd_avx(auVar51,auVar43._16_16_);
      auVar41 = vphaddd_avx(auVar41,auVar51);
      auVar41 = vpshufd_avx(auVar41,0xe8);
      *(long *)*pauVar15 = auVar41._0_8_;
      pauVar15 = (undefined1 (*) [16])(*pauVar15 + 8);
      uVar32 = (ulong)(uVar20 + 2);
    }
    sVar6 = kernel->cstep;
    sVar7 = kernel->elemsize;
    pvVar27 = kernel->data;
    while( true ) {
      uVar20 = (uint)uVar32;
      if ((int)uVar2 <= (int)uVar20) break;
      auVar43 = ZEXT1664((undefined1  [16])0x0);
      for (lVar17 = 0; auVar41 = auVar43._0_16_, iVar38 != (int)lVar17; lVar17 = lVar17 + 1) {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)(local_a8._0_8_ +
                                 lVar17 * 8 +
                                 (ulong)((uVar20 & 1) + ((uint)(uVar32 >> 2) & 0x3fffffff) +
                                        (uint)((uVar20 >> 1 & 1) != 0)) * local_68 * local_a8._16_8_
                                 );
        auVar51 = vpmovsxbw_avx(auVar8);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *(ulong *)((long)pvVar27 + lVar17 * 8 + lVar30 * sVar6 * sVar7);
        auVar40 = vpmovsxbw_avx(auVar1);
        auVar51 = vpmaddwd_avx(auVar51,auVar40);
        auVar41 = vpaddd_avx(auVar51,auVar41);
        auVar43 = ZEXT1664(auVar41);
      }
      auVar41 = vphaddd_avx(auVar41,auVar41);
      auVar41 = vphaddd_avx(auVar41,auVar41);
      *(int *)*pauVar15 = auVar41._0_4_;
      pauVar15 = (undefined1 (*) [16])(*pauVar15 + 4);
      uVar32 = (ulong)(uVar20 + 1);
    }
  }
  piVar13 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
        free((void *)local_a8._0_8_);
      }
      else {
        (*(*(_func_int ***)local_a8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack8to1_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack8to1_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack8to1_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack8to1_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack8to1_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
#if __AVX2__
    if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#else
    if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#endif
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            int64_t* tmpptr = tmp.channel(i / 4);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256i _v = _mm256_loadu_si256((const __m256i*)img0);
                    _mm256_storeu_si256((__m256i*)tmpptr, _v);
                    tmpptr += 4;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = (size - remain_size_start) >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128i _v = _mm_loadu_si128((const __m128i*)img0);
                    _mm_storeu_si128((__m128i*)tmpptr, _v);
                    tmpptr += 2;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr += 1;
                    img0 += size;
                }
            }
        }
    }

    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 4;

        int* outptr0 = top_blob.channel(p);
        int* outptr1 = top_blob.channel(p + 1);
        int* outptr2 = top_blob.channel(p + 2);
        int* outptr3 = top_blob.channel(p + 3);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();

            __m256i _sum04_15 = _mm256_setzero_si256();
            __m256i _sum14_05 = _mm256_setzero_si256();
            __m256i _sum06_17 = _mm256_setzero_si256();
            __m256i _sum16_07 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_madd_epi16(_val01_16, _w01_16));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_madd_epi16(_val10_16, _w01_16));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_madd_epi16(_val01_16, _w23_16));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_madd_epi16(_val10_16, _w23_16));
#endif

                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);
                __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum04_15 = _mm256_dpwssd_epi32(_sum04_15, _val23_16, _w01_16);
                _sum14_05 = _mm256_dpwssd_epi32(_sum14_05, _val32_16, _w01_16);
                _sum06_17 = _mm256_dpwssd_epi32(_sum06_17, _val23_16, _w23_16);
                _sum16_07 = _mm256_dpwssd_epi32(_sum16_07, _val32_16, _w23_16);
#else
                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_madd_epi16(_val23_16, _w01_16));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_madd_epi16(_val32_16, _w01_16));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_madd_epi16(_val23_16, _w23_16));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_madd_epi16(_val32_16, _w23_16));
#endif

                tmpptr += 32;
                kptr0 += 32;
            }

            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum04_15, _sum14_05);
                _tmp1 = _mm256_unpacklo_epi32(_sum06_17, _sum16_07);
                _tmp2 = _mm256_unpackhi_epi32(_sum04_15, _sum14_05);
                _tmp3 = _mm256_unpackhi_epi32(_sum06_17, _sum16_07);
                _sum04_15 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum14_05 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum06_17 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum16_07 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum14_05);
            _sum06_17 = _mm256_add_epi32(_sum06_17, _sum16_07);
            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum06_17);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);
            _sum04_15 = _mm256_permutevar8x32_epi32(_sum04_15, _perm_mask);

            int sum[16];
            _mm256_storeu_si256((__m256i*)sum, _sum00_11);
            _mm256_storeu_si256((__m256i*)(sum + 8), _sum04_15);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0[2] = sum[8];
            outptr1[2] = sum[9];
            outptr2[2] = sum[10];
            outptr3[2] = sum[11];
            outptr0[3] = sum[12];
            outptr1[3] = sum[13];
            outptr2[3] = sum[14];
            outptr3[3] = sum[15];
            outptr0 += 4;
            outptr1 += 4;
            outptr2 += 4;
            outptr3 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum01 = _mm_setzero_si128();
            __m128i _sum02 = _mm_setzero_si128();
            __m128i _sum03 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
            __m128i _sum11 = _mm_setzero_si128();
            __m128i _sum12 = _mm_setzero_si128();
            __m128i _sum13 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_madd_epi16(_val01_16, _w01_16));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_madd_epi16(_val10_16, _w01_16));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_madd_epi16(_val01_16, _w23_16));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_madd_epi16(_val10_16, _w23_16));
#endif
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                _sum02 = _mm_maddd_epi16(_val0, _w2, _sum02);
                _sum03 = _mm_maddd_epi16(_val0, _w3, _sum03);
                _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
                _sum12 = _mm_maddd_epi16(_val1, _w2, _sum12);
                _sum13 = _mm_maddd_epi16(_val1, _w3, _sum13);
#else
                _sum00 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum00);
                _sum01 = _mm_add_epi32(_mm_madd_epi16(_val0, _w1), _sum01);
                _sum02 = _mm_add_epi32(_mm_madd_epi16(_val0, _w2), _sum02);
                _sum03 = _mm_add_epi32(_mm_madd_epi16(_val0, _w3), _sum03);
                _sum10 = _mm_add_epi32(_mm_madd_epi16(_val1, _w0), _sum10);
                _sum11 = _mm_add_epi32(_mm_madd_epi16(_val1, _w1), _sum11);
                _sum12 = _mm_add_epi32(_mm_madd_epi16(_val1, _w2), _sum12);
                _sum13 = _mm_add_epi32(_mm_madd_epi16(_val1, _w3), _sum13);
#endif
#endif

                tmpptr += 16;
                kptr0 += 32;
            }

#if __AVX2__
            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);

            int sum[8];
            _mm256_storeu_si256((__m256i*)sum, _sum00_11);
#else
            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00 = _mm_add_epi32(_sum00, _sum01);
            _sum02 = _mm_add_epi32(_sum02, _sum03);
            _sum10 = _mm_add_epi32(_sum10, _sum11);
            _sum12 = _mm_add_epi32(_sum12, _sum13);

            _sum00 = _mm_add_epi32(_sum00, _sum02);
            _sum10 = _mm_add_epi32(_sum10, _sum12);

            int sum[8];
            _mm_storeu_si128((__m128i*)sum, _sum00);
            _mm_storeu_si128((__m128i*)(sum + 4), _sum10);
#endif

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0 += 2;
            outptr1 += 2;
            outptr2 += 2;
            outptr3 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum0_1 = _mm256_setzero_si256();
            __m256i _sum2_3 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                _val = _mm_cvtepi8_epi16(_val);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _valval = _mm256_inserti128_si256(_mm256_castsi128_si256(_val), _val, 1);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum0_1 = _mm256_dpwssd_epi32(_sum0_1, _valval, _w01_16);
                _sum2_3 = _mm256_dpwssd_epi32(_sum2_3, _valval, _w23_16);
#else
                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_madd_epi16(_valval, _w01_16));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_madd_epi16(_valval, _w23_16));
#endif
#else
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                _val = _mm_cvtepi8_epi16(_val);
#else
                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));
#endif

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val, _w0, _sum0);
                _sum1 = _mm_maddd_epi16(_val, _w1, _sum1);
                _sum2 = _mm_maddd_epi16(_val, _w2, _sum2);
                _sum3 = _mm_maddd_epi16(_val, _w3, _sum3);
#else
                _sum0 = _mm_add_epi32(_mm_madd_epi16(_val, _w0), _sum0);
                _sum1 = _mm_add_epi32(_mm_madd_epi16(_val, _w1), _sum1);
                _sum2 = _mm_add_epi32(_mm_madd_epi16(_val, _w2), _sum2);
                _sum3 = _mm_add_epi32(_mm_madd_epi16(_val, _w3), _sum3);
#endif
#endif

                tmpptr += 8;
                kptr0 += 32;
            }

#if __AVX2__
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_1, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum0_1, 1);
            __m128i _sum2 = _mm256_extracti128_si256(_sum2_3, 0);
            __m128i _sum3 = _mm256_extracti128_si256(_sum2_3, 1);
#endif

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);

            _sum0 = _mm_add_epi32(_sum0, _sum2);

            int sum[4];
            _mm_storeu_si128((__m128i*)sum, _sum0);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0 += 1;
            outptr1 += 1;
            outptr2 += 1;
            outptr3 += 1;
        }
    }

    remain_outch_start += nn_outch << 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum01 = _mm256_setzero_si256();
            __m256i _sum23 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                _w01_16 = _mm256_permute4x64_epi64(_w01_16, _MM_SHUFFLE(1, 0, 1, 0));

#if __AVXVNNI__ || __AVX512VNNI__
                _sum01 = _mm256_dpwssd_epi32(_sum01, _val01_16, _w01_16);
                _sum23 = _mm256_dpwssd_epi32(_sum23, _val23_16, _w01_16);
#else
                _sum01 = _mm256_add_epi32(_sum01, _mm256_madd_epi16(_val01_16, _w01_16));
                _sum23 = _mm256_add_epi32(_sum23, _mm256_madd_epi16(_val23_16, _w01_16));
#endif

                tmpptr += 32;
                kptr0 += 8;
            }

            __m128i _sum0 = _mm256_extracti128_si256(_sum01, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum01, 1);
            __m128i _sum2 = _mm256_extracti128_si256(_sum23, 0);
            __m128i _sum3 = _mm256_extracti128_si256(_sum23, 1);

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0[1] = _mm_reduce_add_epi32(_sum1);
            outptr0[2] = _mm_reduce_add_epi32(_sum2);
            outptr0[3] = _mm_reduce_add_epi32(_sum3);
            outptr0 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum01 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                _w01_16 = _mm256_permute4x64_epi64(_w01_16, _MM_SHUFFLE(1, 0, 1, 0));

#if __AVXVNNI__ || __AVX512VNNI__
                _sum01 = _mm256_dpwssd_epi32(_sum01, _val01_16, _w01_16);
#else
                _sum01 = _mm256_add_epi32(_sum01, _mm256_madd_epi16(_val01_16, _w01_16));
#endif
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                __m128i _w0 = _mm_cvtepi8_epi16(_w01);
#else
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
#endif

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val0, _w0, _sum0);
                _sum1 = _mm_maddd_epi16(_val1, _w0, _sum1);
#else
                _sum0 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum0);
                _sum1 = _mm_add_epi32(_mm_madd_epi16(_val1, _w0), _sum1);
#endif
#endif

                tmpptr += 16;
                kptr0 += 8;
            }

#if __AVX2__
            __m128i _sum0 = _mm256_extracti128_si256(_sum01, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum01, 1);
#endif

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0[1] = _mm_reduce_add_epi32(_sum1);
            outptr0 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

            __m128i _sum0 = _mm_setzero_si128();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                __m128i _val0 = _mm_cvtepi8_epi16(_val01);
#else
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                __m128i _w0 = _mm_cvtepi8_epi16(_w01);
#else
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
#endif

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val0, _w0, _sum0);
#else
                _sum0 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum0);
#endif

                tmpptr += 8;
                kptr0 += 8;
            }

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0 += 1;
        }
    }
}